

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanillaSynapseBuilder.cpp
# Opt level: O0

ISynapse * __thiscall
VanillaSynapseBuilder::Build
          (VanillaSynapseBuilder *this,size_t layerSize,size_t nextLayerSize,INeuron *prev,
          INeuron *next)

{
  byte bVar1;
  BasicSynapse *this_00;
  result_type _strength;
  double dVar2;
  float local_50;
  uniform_real_distribution<float> local_3c;
  uniform_real_distribution<float> distribution;
  float limit;
  INeuron *next_local;
  INeuron *prev_local;
  size_t nextLayerSize_local;
  size_t layerSize_local;
  VanillaSynapseBuilder *this_local;
  
  local_50 = (float)nextLayerSize;
  unique0x10000099 = next;
  dVar2 = sqrt((double)(3.0 / local_50));
  distribution._M_param._M_a = (float)dVar2;
  std::uniform_real_distribution<float>::uniform_real_distribution
            (&local_3c,0.0,distribution._M_param._M_a);
  this_00 = (BasicSynapse *)operator_new(0x40);
  bVar1 = (byte)ISynapse::DEFAULT_SYNAPSE_UPDATABILITY;
  _strength = std::uniform_real_distribution<float>::operator()
                        (&local_3c,(this->super_ISynapseBuilder).generator);
  BasicSynapse::BasicSynapse
            (this_00,(bool)(bVar1 & 1),_strength,(Time)ISynapse::DEFAULT_SYNAPSE_DELAY,prev,
             stack0xffffffffffffffd0);
  return &this_00->super_ISynapse;
}

Assistant:

ISynapse *VanillaSynapseBuilder::Build( size_t layerSize, size_t nextLayerSize, INeuron *prev, INeuron *next ) const
{
//    3 stands for some fixed constant from the article
    float limit = sqrt( 3.f / ( static_cast<float>( nextLayerSize )));
    std::uniform_real_distribution<float> distribution( 0, limit );
    return new BasicSynapse(
            ISynapse::DEFAULT_SYNAPSE_UPDATABILITY,
            distribution( generator ),
            ISynapse::DEFAULT_SYNAPSE_DELAY,
            prev, next );
}